

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_register_gui_component_parse_color_3(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x1c);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_gui_component_parse_color_3;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"gui.component_parse_color_3",0x1c);
  return;
}

Assistant:

UTEST(gui, component_parse_color_3) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "color3";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.UniformType == EGUIUniformTypeVec3);
    T(error.empty());

#if 0
    line = "color3()";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));

    line = "color3(5.0)";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(2, line, uniform_line, {}, component, error));
#endif

    line = "color3(0.1, -1, 2.5)";
    for (const auto& datatype : {"float", "vec2"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}